

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.hpp
# Opt level: O2

critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
* __thiscall
diy::
concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
::operator[](concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
             *this,int *x)

{
  mapped_type *pmVar1;
  lock_guard<fast_mutex> l;
  unique_lock<tthread::fast_mutex> local_20;
  
  std::unique_lock<tthread::fast_mutex>::unique_lock(&local_20,&this->mutex_);
  pmVar1 = std::
           map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
           ::operator[](&this->map_,x);
  std::unique_lock<tthread::fast_mutex>::~unique_lock(&local_20);
  return pmVar1;
}

Assistant:

U&              operator[](const T& x)  { lock_guard<fast_mutex> l(mutex_); return map_[x]; }